

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Singleton.cpp
# Opt level: O2

Singleton * Singleton::Lookup(char *name)

{
  int iVar1;
  ostream *poVar2;
  Iterator<NameSingletonPair> *pIVar3;
  undefined4 extraout_var;
  char *pcVar4;
  Singleton *pSVar5;
  NameSingletonPair pair;
  NameSingletonPair local_30;
  
  poVar2 = std::operator<<((ostream *)&std::cout,"Singleton::Lookup(const char*)");
  std::endl<char,std::char_traits<char>>(poVar2);
  pIVar3 = List<NameSingletonPair>::CreateIterator(_registry);
  (**pIVar3->_vptr_Iterator)(pIVar3);
  while( true ) {
    iVar1 = (*pIVar3->_vptr_Iterator[2])(pIVar3);
    if ((char)iVar1 != '\0') {
      return (Singleton *)0x0;
    }
    iVar1 = (*pIVar3->_vptr_Iterator[3])(pIVar3);
    local_30._name = (char *)CONCAT44(extraout_var,iVar1);
    pcVar4 = NameSingletonPair::GetName(&local_30);
    if (pcVar4 == name) break;
    (*pIVar3->_vptr_Iterator[1])(pIVar3);
  }
  pSVar5 = NameSingletonPair::GetSingleton(&local_30);
  return pSVar5;
}

Assistant:

Singleton* Singleton::Lookup(const char* name)
{

    std::cout << "Singleton::Lookup(const char*)" << std::endl;

    Iterator<NameSingletonPair>* i = _registry->CreateIterator();
    for (i->First(); !i->IsDone(); i->Next()) {
        NameSingletonPair pair = i->CurrentItem();
        if (pair.GetName() == name) {
            return pair.GetSingleton();
        }
    }
    return 0;
}